

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

int32_t __thiscall icu_63::RuleBasedCollator::hashCode(RuleBasedCollator *this)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  uint uVar5;
  UnicodeSet *p;
  LocalPointer<icu_63::UnicodeSet> set;
  UErrorCode errorCode;
  UnicodeSetIterator iter;
  int local_6c;
  UnicodeSetIterator local_68;
  UnicodeSet *uSet;
  
  uVar2 = CollationSettings::hashCode(this->settings);
  if (this->data->base != (CollationData *)0x0) {
    p = (UnicodeSet *)&local_6c;
    local_6c = 0;
    iVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x1f])(this);
    uSet = (UnicodeSet *)CONCAT44(extraout_var,iVar3);
    uVar5 = 0;
    if (local_6c < 1) {
      p = uSet;
      UnicodeSetIterator::UnicodeSetIterator(&local_68,uSet);
      while ((UVar1 = UnicodeSetIterator::next(&local_68), UVar1 != '\0' &&
             (p = (UnicodeSet *)(ulong)(uint)local_68.codepoint, local_68.codepoint != 0xffffffff)))
      {
        uVar4 = CollationData::getCE32(this->data,local_68.codepoint);
        uVar2 = uVar2 ^ uVar4;
      }
      UnicodeSetIterator::~UnicodeSetIterator(&local_68);
      uVar5 = uVar2;
    }
    if (uSet != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(uSet);
    }
    UMemory::operator_delete((UMemory *)uSet,p);
    uVar2 = uVar5;
  }
  return uVar2;
}

Assistant:

int32_t
RuleBasedCollator::hashCode() const {
    int32_t h = settings->hashCode();
    if(data->base == NULL) { return h; }  // root collator
    // Do not rely on the rule string, see comments in operator==().
    UErrorCode errorCode = U_ZERO_ERROR;
    LocalPointer<UnicodeSet> set(getTailoredSet(errorCode));
    if(U_FAILURE(errorCode)) { return 0; }
    UnicodeSetIterator iter(*set);
    while(iter.next() && !iter.isString()) {
        h ^= data->getCE32(iter.getCodepoint());
    }
    return h;
}